

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O0

sexp_conflict
sexp_free_pollfds(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict pollfds)

{
  long in_RCX;
  
  if (*(long *)(in_RCX + 8) != 0) {
    free(*(void **)(in_RCX + 8));
    *(undefined8 *)(in_RCX + 8) = 0;
    *(undefined8 *)(in_RCX + 0x10) = 0;
    *(undefined8 *)(in_RCX + 0x18) = 0;
  }
  return (sexp_conflict)0x43e;
}

Assistant:

sexp sexp_free_pollfds (sexp ctx, sexp self, sexp_sint_t n, sexp pollfds) {
  if (sexp_pollfds_fds(pollfds)) {
    free(sexp_pollfds_fds(pollfds));
    sexp_pollfds_fds(pollfds) = NULL;
    sexp_pollfds_num_fds(pollfds) = 0;
    sexp_pollfds_max_fds(pollfds) = 0;
  }
  return SEXP_VOID;
}